

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::CreateObject
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phObject,int op)

{
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  CK_STATE sessionState;
  ulong uVar5;
  CK_OBJECT_HANDLE CVar6;
  CK_ULONG in_RCX;
  CK_ATTRIBUTE_PTR p_Var7;
  CK_ATTRIBUTE_PTR in_RDX;
  long in_RDI;
  CK_OBJECT_HANDLE *in_R8;
  int in_R9D;
  OSObject *object;
  P11Object *p11object;
  CK_ULONG i_1;
  CK_ULONG i;
  CK_ULONG saveAttribsCount;
  CK_ULONG attribsCount;
  CK_ATTRIBUTE saveAttribs [32];
  CK_ATTRIBUTE attribs [32];
  CK_ULONG maxAttribs;
  CK_RV rv;
  bool isImplicit;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  CK_CERTIFICATE_TYPE certType;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  Token *token;
  Slot *slot;
  Session *session;
  Session *this_00;
  undefined1 value;
  undefined4 in_stack_fffffffffffff614;
  CK_SESSION_HANDLE in_stack_fffffffffffff650;
  undefined1 *puVar8;
  undefined4 in_stack_fffffffffffff658;
  undefined1 in_stack_fffffffffffff65c;
  undefined1 in_stack_fffffffffffff65d;
  byte bVar9;
  undefined1 in_stack_fffffffffffff65e;
  undefined1 in_stack_fffffffffffff65f;
  CK_ATTRIBUTE_PTR in_stack_fffffffffffff660;
  SessionObject *pSVar10;
  undefined8 in_stack_fffffffffffff668;
  undefined1 isPrivate_00;
  undefined5 in_stack_fffffffffffff670;
  undefined1 in_stack_fffffffffffff675;
  undefined1 in_stack_fffffffffffff676;
  undefined1 in_stack_fffffffffffff677;
  byte bVar11;
  P11Object *in_stack_fffffffffffff678;
  undefined1 isPrivate_01;
  undefined7 in_stack_fffffffffffff698;
  undefined1 in_stack_fffffffffffff69f;
  CK_SLOT_ID in_stack_fffffffffffff6a0;
  SessionObjectStore *in_stack_fffffffffffff6a8;
  P11Object **in_stack_fffffffffffff6d0;
  undefined7 in_stack_fffffffffffff6d8;
  undefined1 in_stack_fffffffffffff6df;
  undefined7 in_stack_fffffffffffff6e0;
  undefined1 in_stack_fffffffffffff6e7;
  HandleManager *in_stack_fffffffffffff6e8;
  CK_SLOT_ID in_stack_fffffffffffff6f0;
  HandleManager *in_stack_fffffffffffff6f8;
  undefined1 local_8b8 [167];
  byte local_811;
  undefined1 local_810 [183];
  byte local_759;
  undefined1 local_758 [40];
  SessionObject *local_6b8;
  ulong local_6a8;
  ulong local_6a0;
  ulong local_698;
  long local_690;
  CK_ATTRIBUTE_TYPE local_688 [96];
  CK_ATTRIBUTE_TYPE local_388 [97];
  undefined8 local_80;
  CK_RV local_78;
  undefined1 local_6b;
  undefined1 local_6a [54];
  int local_34;
  CK_OBJECT_HANDLE *local_30;
  CK_ULONG local_28;
  CK_ATTRIBUTE_PTR local_20;
  CK_RV local_8;
  
  isPrivate_00 = (undefined1)((ulong)in_stack_fffffffffffff668 >> 0x38);
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RDX == (CK_ATTRIBUTE_PTR)0x0) {
    local_8 = 7;
  }
  else if (in_R8 == (CK_OBJECT_HANDLE *)0x0) {
    local_8 = 7;
  }
  else {
    local_34 = in_R9D;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_6a._42_8_ =
         HandleManager::getSession
                   ((HandleManager *)
                    CONCAT17(in_stack_fffffffffffff65f,
                             CONCAT16(in_stack_fffffffffffff65e,
                                      CONCAT15(in_stack_fffffffffffff65d,
                                               CONCAT14(in_stack_fffffffffffff65c,
                                                        in_stack_fffffffffffff658)))),
                    in_stack_fffffffffffff650);
    iVar4 = (int)(in_stack_fffffffffffff650 >> 0x20);
    isPrivate_01 = (undefined1)((ulong)in_RDI >> 0x38);
    if ((Session *)local_6a._42_8_ == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      local_6a._34_8_ = Session::getSlot((Session *)local_6a._42_8_);
      if ((Slot *)local_6a._34_8_ == (Slot *)0x0) {
        local_8 = 5;
      }
      else {
        local_6a._26_8_ = Session::getToken((Session *)local_6a._42_8_);
        if ((Token *)local_6a._26_8_ == (Token *)0x0) {
          local_8 = 5;
        }
        else {
          local_6a._18_8_ = 0;
          local_6a._10_8_ = 0;
          local_6a._2_8_ = 0;
          local_6a[1] = '\0';
          local_6a[0] = '\x01';
          local_6b = 0;
          this_00 = (Session *)local_6a;
          uVar2 = 0;
          local_78 = extractObjectInformation
                               (local_20,local_28,(CK_OBJECT_CLASS *)(local_6a + 0x12),
                                (CK_KEY_TYPE *)(local_6a + 10),(CK_CERTIFICATE_TYPE *)(local_6a + 2)
                                ,local_6a + 1,(CK_BBOOL *)this_00,false);
          if (local_78 == 0) {
            sessionState = Session::getState(this_00);
            value = (undefined1)((ulong)this_00 >> 0x38);
            local_78 = haveWrite(sessionState,local_6a[1],local_6a[0]);
            if (local_78 == 0) {
              local_80 = 0x20;
              local_690 = 0;
              local_698 = 0;
              if (local_28 < 0x21) {
                for (local_6a0 = 0; local_6a0 < local_28; local_6a0 = local_6a0 + 1) {
                  if (local_20[local_6a0].type == 0x90) {
                    p_Var7 = local_20 + local_6a0;
                    local_688[local_698 * 3] = p_Var7->type;
                    local_688[local_698 * 3 + 1] = (CK_ATTRIBUTE_TYPE)p_Var7->pValue;
                    local_688[local_698 * 3 + 2] = p_Var7->ulValueLen;
                    local_698 = local_698 + 1;
                  }
                  else {
                    p_Var7 = local_20 + local_6a0;
                    local_388[local_690 * 3] = p_Var7->type;
                    local_388[local_690 * 3 + 1] = (CK_ATTRIBUTE_TYPE)p_Var7->pValue;
                    local_388[local_690 * 3 + 2] = p_Var7->ulValueLen;
                    local_690 = local_690 + 1;
                  }
                }
                for (local_6a8 = 0; local_6a8 < local_698; local_6a8 = local_6a8 + 1) {
                  local_388[local_690 * 3] = local_688[local_6a8 * 3];
                  local_388[local_690 * 3 + 1] = local_688[local_6a8 * 3 + 1];
                  local_388[local_690 * 3 + 2] = local_688[local_6a8 * 3 + 2];
                  local_690 = local_690 + 1;
                }
                local_78 = newP11Object((CK_OBJECT_CLASS)in_stack_fffffffffffff6e8,
                                        CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0
                                                ),
                                        CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8
                                                ),in_stack_fffffffffffff6d0);
                local_8 = local_78;
                if (local_78 == 0) {
                  if (local_6a[1] == '\0') {
                    Slot::getSlotID((Slot *)local_6a._34_8_);
                    local_6b8 = SessionObjectStore::createObject
                                          (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                                           CONCAT17(in_stack_fffffffffffff69f,
                                                    in_stack_fffffffffffff698),(bool)isPrivate_01);
                  }
                  else {
                    local_6b8 = (SessionObject *)Token::createObject((Token *)0x163118);
                  }
                  if ((local_6b8 == (SessionObject *)0x0) ||
                     (uVar5 = (**(code **)(lRam0000000000000000 + 0x10))(0,local_6b8),
                     (uVar5 & 1) == 0)) {
                    local_8 = 5;
                  }
                  else {
                    local_78 = P11Object::saveTemplate
                                         (in_stack_fffffffffffff678,
                                          (Token *)CONCAT17(in_stack_fffffffffffff677,
                                                            CONCAT16(in_stack_fffffffffffff676,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffff675,
                                                  in_stack_fffffffffffff670))),(bool)isPrivate_00,
                                          in_stack_fffffffffffff660,
                                          CONCAT17(in_stack_fffffffffffff65f,
                                                   CONCAT16(in_stack_fffffffffffff65e,
                                                            CONCAT15(in_stack_fffffffffffff65d,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffff65c,
                                                  in_stack_fffffffffffff658)))),iVar4);
                    local_8 = local_78;
                    if (local_78 == 0) {
                      if (local_34 == 2) {
                        local_759 = 0;
                        bVar11 = 0;
                        if (local_6a._18_8_ == 2) {
                          uVar3 = (*(local_6b8->super_OSObject)._vptr_OSObject[0xb])(local_6b8,1);
                          bVar11 = 1;
                          if ((uVar3 & 1) != 0) {
                            puVar8 = local_758;
                            pSVar10 = local_6b8;
                            OSAttribute::OSAttribute
                                      ((OSAttribute *)CONCAT44(in_stack_fffffffffffff614,uVar2),
                                       (bool)value);
                            local_759 = 1;
                            uVar3 = (*(pSVar10->super_OSObject)._vptr_OSObject[8])
                                              (pSVar10,0x163,puVar8);
                            bVar11 = 1;
                            if ((uVar3 & 1) != 0) {
                              iVar4 = (*(local_6b8->super_OSObject)._vptr_OSObject[0xc])();
                              bVar11 = (byte)iVar4 ^ 0xff;
                            }
                          }
                        }
                        if ((local_759 & 1) != 0) {
                          OSAttribute::~OSAttribute
                                    ((OSAttribute *)CONCAT44(in_stack_fffffffffffff614,uVar2));
                        }
                        if ((bVar11 & 1) != 0) {
                          return 5;
                        }
                        local_811 = 0;
                        bVar1 = false;
                        bVar11 = 0;
                        if ((local_6a._18_8_ == 4) || (bVar9 = 0, local_6a._18_8_ == 3)) {
                          uVar3 = (*(local_6b8->super_OSObject)._vptr_OSObject[0xb])(local_6b8,1);
                          bVar9 = 1;
                          if ((uVar3 & 1) != 0) {
                            puVar8 = local_810;
                            OSAttribute::OSAttribute
                                      ((OSAttribute *)CONCAT44(in_stack_fffffffffffff614,uVar2),
                                       (bool)value);
                            local_811 = 1;
                            uVar3 = (*(local_6b8->super_OSObject)._vptr_OSObject[8])
                                              (local_6b8,0x163,puVar8);
                            bVar9 = 1;
                            if ((uVar3 & 1) != 0) {
                              OSAttribute::OSAttribute
                                        ((OSAttribute *)CONCAT44(in_stack_fffffffffffff614,uVar2),
                                         (bool)value);
                              bVar1 = true;
                              uVar3 = (*(local_6b8->super_OSObject)._vptr_OSObject[8])
                                                (local_6b8,0x165,local_8b8);
                              bVar9 = 1;
                              if ((uVar3 & 1) != 0) {
                                OSAttribute::OSAttribute
                                          ((OSAttribute *)CONCAT44(in_stack_fffffffffffff614,uVar2),
                                           (bool)value);
                                bVar11 = 1;
                                uVar3 = (*(local_6b8->super_OSObject)._vptr_OSObject[8])
                                                  (local_6b8,0x164,&stack0xfffffffffffff6a0);
                                bVar9 = 1;
                                if ((uVar3 & 1) != 0) {
                                  iVar4 = (*(local_6b8->super_OSObject)._vptr_OSObject[0xc])();
                                  bVar9 = (byte)iVar4 ^ 0xff;
                                }
                              }
                            }
                          }
                        }
                        if ((bVar11 & 1) != 0) {
                          OSAttribute::~OSAttribute
                                    ((OSAttribute *)CONCAT44(in_stack_fffffffffffff614,uVar2));
                        }
                        if (bVar1) {
                          OSAttribute::~OSAttribute
                                    ((OSAttribute *)CONCAT44(in_stack_fffffffffffff614,uVar2));
                        }
                        if ((local_811 & 1) != 0) {
                          OSAttribute::~OSAttribute
                                    ((OSAttribute *)CONCAT44(in_stack_fffffffffffff614,uVar2));
                        }
                        if ((bVar9 & 1) != 0) {
                          return 5;
                        }
                      }
                      if (local_6a[1] == '\0') {
                        Slot::getSlotID((Slot *)local_6a._34_8_);
                        CVar6 = HandleManager::addSessionObject
                                          (in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                                           (CK_SESSION_HANDLE)in_stack_fffffffffffff6e8,
                                           (bool)in_stack_fffffffffffff6e7,
                                           (CK_VOID_PTR)
                                           CONCAT17(in_stack_fffffffffffff6df,
                                                    in_stack_fffffffffffff6d8));
                        *local_30 = CVar6;
                      }
                      else {
                        Slot::getSlotID((Slot *)local_6a._34_8_);
                        CVar6 = HandleManager::addTokenObject
                                          (in_stack_fffffffffffff6e8,
                                           CONCAT17(in_stack_fffffffffffff6e7,
                                                    in_stack_fffffffffffff6e0),
                                           (bool)in_stack_fffffffffffff6df,in_stack_fffffffffffff6d0
                                          );
                        *local_30 = CVar6;
                      }
                      local_8 = 0;
                    }
                  }
                }
              }
              else {
                local_8 = 0xd1;
              }
            }
            else {
              if (local_78 == 0x101) {
                softHSMLog(6,"CreateObject",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x2e9f,"User is not authorized");
              }
              if (local_78 == 0xb5) {
                softHSMLog(6,"CreateObject",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x2ea1,"Session is read-only");
              }
              local_8 = local_78;
            }
          }
          else {
            softHSMLog(3,"CreateObject",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x2e96,"Mandatory attribute not present in template");
            local_8 = local_78;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::CreateObject(CK_SESSION_HANDLE hSession, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount, CK_OBJECT_HANDLE_PTR phObject, int op)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phObject == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Extract information from the template that is needed to create the object.
	CK_OBJECT_CLASS objClass = CKO_DATA;
	CK_KEY_TYPE keyType = CKK_RSA;
	CK_CERTIFICATE_TYPE certType = CKC_X_509;
	CK_BBOOL isOnToken = CK_FALSE;
	CK_BBOOL isPrivate = CK_TRUE;
	bool isImplicit = false;
	CK_RV rv = extractObjectInformation(pTemplate,ulCount,objClass,keyType,certType, isOnToken, isPrivate, isImplicit);
	if (rv != CKR_OK)
	{
		ERROR_MSG("Mandatory attribute not present in template");
		return rv;
	}

	// Check user credentials
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Change order of attributes
	const CK_ULONG maxAttribs = 32;
	CK_ATTRIBUTE attribs[maxAttribs];
	CK_ATTRIBUTE saveAttribs[maxAttribs];
	CK_ULONG attribsCount = 0;
	CK_ULONG saveAttribsCount = 0;
	if (ulCount > maxAttribs)
	{
		return CKR_TEMPLATE_INCONSISTENT;
	}
	for (CK_ULONG i=0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CHECK_VALUE:
				saveAttribs[saveAttribsCount++] = pTemplate[i];
				break;
			default:
				attribs[attribsCount++] = pTemplate[i];
		}
	}
	for (CK_ULONG i=0; i < saveAttribsCount; i++)
	{
		attribs[attribsCount++] = saveAttribs[i];
	}

	P11Object* p11object = NULL;
	rv = newP11Object(objClass,keyType,certType,&p11object);
	if (rv != CKR_OK)
		return rv;

	// Create the object in session or on the token
	OSObject *object = NULL_PTR;
	if (isOnToken)
	{
		object = (OSObject*) token->createObject();
	}
	else
	{
		object = sessionObjectStore->createObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE);
	}

	if (object == NULL || !p11object->init(object))
	{
		delete p11object;
		return CKR_GENERAL_ERROR;
	}

	rv = p11object->saveTemplate(token, isPrivate != CK_FALSE, attribs,attribsCount,op);
	delete p11object;
	if (rv != CKR_OK)
		return rv;

	if (op == OBJECT_OP_CREATE)
	{
		if (objClass == CKO_PUBLIC_KEY &&
		    (!object->startTransaction() ||
		    !object->setAttribute(CKA_LOCAL, false) ||
		    !object->commitTransaction()))
		{
			return CKR_GENERAL_ERROR;
		}

		if ((objClass == CKO_SECRET_KEY || objClass == CKO_PRIVATE_KEY) &&
		    (!object->startTransaction() ||
		    !object->setAttribute(CKA_LOCAL, false) ||
		    !object->setAttribute(CKA_ALWAYS_SENSITIVE, false) ||
		    !object->setAttribute(CKA_NEVER_EXTRACTABLE, false) ||
		    !object->commitTransaction()))
		{
			return CKR_GENERAL_ERROR;
		}
	}

	if (isOnToken)
	{
		*phObject = handleManager->addTokenObject(slot->getSlotID(), isPrivate != CK_FALSE, object);
	} else {
		*phObject = handleManager->addSessionObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE, object);
	}

	return CKR_OK;
}